

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

PHYSFS_sint64 zip_dos_time_to_physfs_time(PHYSFS_uint32 dostime)

{
  uint uVar1;
  time_t tVar2;
  undefined1 local_48 [8];
  tm unixtime;
  PHYSFS_uint32 dosdate;
  PHYSFS_uint32 dostime_local;
  
  unixtime.tm_zone._4_4_ = dostime;
  memset(local_48,0,0x38);
  unixtime.tm_zone._0_4_ = unixtime.tm_zone._4_4_ >> 0x10;
  uVar1 = unixtime.tm_zone._4_4_ & 0xffff;
  unixtime.tm_mday = (unixtime.tm_zone._4_4_ >> 0x19) + 0x50;
  unixtime.tm_hour = (unixtime.tm_zone._4_4_ >> 0x15 & 0xf) - 1;
  unixtime.tm_min = (uint)unixtime.tm_zone & 0x1f;
  unixtime.tm_sec = uVar1 >> 0xb;
  local_48._4_4_ = uVar1 >> 5 & 0x3f;
  local_48._0_4_ = (unixtime.tm_zone._4_4_ & 0x1f) << 1;
  unixtime.tm_wday = -1;
  unixtime.tm_zone._4_4_ = uVar1;
  tVar2 = mktime((tm *)local_48);
  return tVar2;
}

Assistant:

static PHYSFS_sint64 zip_dos_time_to_physfs_time(PHYSFS_uint32 dostime)
{
    PHYSFS_uint32 dosdate;
    struct tm unixtime;
    memset(&unixtime, '\0', sizeof (unixtime));

    dosdate = (PHYSFS_uint32) ((dostime >> 16) & 0xFFFF);
    dostime &= 0xFFFF;

    /* dissect date */
    unixtime.tm_year = ((dosdate >> 9) & 0x7F) + 80;
    unixtime.tm_mon  = ((dosdate >> 5) & 0x0F) - 1;
    unixtime.tm_mday = ((dosdate     ) & 0x1F);

    /* dissect time */
    unixtime.tm_hour = ((dostime >> 11) & 0x1F);
    unixtime.tm_min  = ((dostime >>  5) & 0x3F);
    unixtime.tm_sec  = ((dostime <<  1) & 0x3E);

    /* let mktime calculate daylight savings time. */
    unixtime.tm_isdst = -1;

    return ((PHYSFS_sint64) mktime(&unixtime));
}